

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::appender::append16
          (appender *this,char16_t cu)

{
  bool bVar1;
  char32_t cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar4;
  _func_unsigned_short_unsigned_short *in_RCX;
  pair<const_char16_t_*,_char32_t> pVar5;
  char32_t code_point_1;
  tuple<char16_t_const*&,char32_t&> local_60 [16];
  char16_t *local_50;
  char32_t local_48;
  pair<const_char16_t_*,_char32_t> local_40;
  char32_t local_2c;
  char16_t *pcStack_28;
  char32_t code_point;
  char16_t *last;
  char16_t *first;
  char16_t surrogates [2];
  bool ok;
  char16_t cu_local;
  appender *this_local;
  
  first._5_1_ = 1;
  first._6_2_ = cu;
  _surrogates = this;
  bVar1 = utf::is_utf16_high_surrogate(cu);
  if (bVar1) {
    bVar1 = has_high_surrogate(this);
    if (bVar1) {
      first._5_1_ = 0;
    }
    else {
      this->high_surrogate_ = first._6_2_;
    }
  }
  else {
    bVar1 = utf::is_utf16_low_surrogate(first._6_2_);
    if (bVar1) {
      bVar1 = has_high_surrogate(this);
      if (bVar1) {
        first._0_2_ = this->high_surrogate_;
        first._2_2_ = first._6_2_;
        last = std::begin<char16_t_const,2ul>((char16_t (*) [2])&first);
        pcStack_28 = std::end<char16_t_const,2ul>((char16_t (*) [2])&first);
        local_2c = L'\0';
        pVar5 = utf::utf16_to_code_point<char16_t_const*,unsigned_short(*)(unsigned_short)>
                          ((utf *)last,pcStack_28,(char16_t *)utf::nop_swapper,in_RCX);
        local_50 = pVar5.first;
        local_48 = pVar5.second;
        local_40.first = local_50;
        local_40.second = local_48;
        std::tie<char16_t_const*,char32_t>((char16_t **)local_60,(char32_t *)&last);
        std::tuple<char16_t_const*&,char32_t&>::operator=(local_60,&local_40);
        cVar2 = local_2c;
        pbVar3 = gsl::not_null::operator_cast_to_string_((not_null *)this);
        bVar4 = std::back_inserter<std::__cxx11::string>(pbVar3);
        utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>(cVar2,bVar4);
        this->high_surrogate_ = L'\0';
      }
      else {
        first._5_1_ = 0;
      }
    }
    else {
      bVar1 = has_high_surrogate(this);
      if (bVar1) {
        first._5_1_ = 0;
      }
      else {
        cVar2 = (char32_t)(ushort)first._6_2_;
        pbVar3 = gsl::not_null::operator_cast_to_string_((not_null *)this);
        bVar4 = std::back_inserter<std::__cxx11::string>(pbVar3);
        utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>(cVar2,bVar4);
      }
    }
  }
  return (bool)(first._5_1_ & 1);
}

Assistant:

bool string_matcher<Callbacks>::appender::append16 (char16_t const cu) {
                bool ok = true;
                if (utf::is_utf16_high_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        high_surrogate_ = cu;
                    } else {
                        // A high surrogate following another high surrogate.
                        ok = false;
                    }
                } else if (utf::is_utf16_low_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        // A low surrogate following by something other than a high surrogate.
                        ok = false;
                    } else {
                        char16_t const surrogates[] = {high_surrogate_, cu};
                        auto first = std::begin (surrogates);
                        auto const last = std::end (surrogates);
                        auto code_point = char32_t{0};
                        std::tie (first, code_point) =
                            utf::utf16_to_code_point (first, last, utf::nop_swapper);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                        high_surrogate_ = 0;
                    }
                } else {
                    if (this->has_high_surrogate ()) {
                        // A high surrogate followed by something other than a low surrogate.
                        ok = false;
                    } else {
                        auto const code_point = static_cast<char32_t> (cu);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                    }
                }
                return ok;
            }